

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O1

strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
* __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::_impl::
map<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>const&,____C_A_T_C_H____T_E_S_T____28()::__0&>
          (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,_impl *this,
          strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
          *t,anon_class_1_0_00000001 *fn)

{
  pointer pcVar1;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar2;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  anon_class_1_0_00000001 local_39;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  byte local_18;
  
  if (this[0x20] == (_impl)0x0) {
    pvVar3 = std::get<0ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._M_first._M_storage = (_Uninitialized<int,_true>)(*pvVar3 * 2);
    local_18 = 0;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_18]._M_data)
              (&local_39,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_38);
  }
  else {
    pvVar2 = std::get<1ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._0_8_ = (long)&local_38 + 0x10;
    pcVar1 = (pvVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + pvVar2->_M_string_length);
    local_18 = 1;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_18]._M_data)
              (&local_39,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static constexpr decltype(auto) map(ST&& t, Fn&& fn)
        {
          using dST = ezy::remove_cvref_t<ST>;
          using trait = Adapter<typename dST::type>;

          // TODO static_assert(std::is_invocable_v<Fn(success_type)>, "Fn must be invocable with success_type");
          using fn_result_type = decltype(ezy::invoke(fn, std::declval<typename trait::success_type>()));

          using R = typename trait::template rebind_success_t<fn_result_type>;
          using new_trait = Adapter<R>;
          using return_type = rebind_strong_type_t<dST, R>;

          return map<return_type, new_trait>(std::forward<ST>(t), std::forward<Fn>(fn));
        }